

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

string * kaitai::kstream::process_xor_many(string *__return_storage_ptr__,string *data,string *key)

{
  size_type sVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  
  sVar1 = data->_M_string_length;
  uVar2 = key->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1);
  if (sVar1 != 0) {
    sVar3 = 0;
    uVar4 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[sVar3] =
           (key->_M_dataplus)._M_p[uVar4] ^ (data->_M_dataplus)._M_p[sVar3];
      uVar4 = uVar4 + 1;
      if (uVar2 <= uVar4) {
        uVar4 = 0;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::process_xor_many(std::string data, std::string key) {
    size_t len = data.length();
    size_t kl = key.length();
    std::string result(len, ' ');

    size_t ki = 0;
    for (size_t i = 0; i < len; i++) {
        result[i] = data[i] ^ key[ki];
        ki++;
        if (ki >= kl)
            ki = 0;
    }

    return result;
}